

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O1

void __thiscall
cmTestGenerator::GenerateScriptActions(cmTestGenerator *this,ostream *os,Indent indent)

{
  char cVar1;
  cmTest *pcVar2;
  cmMakefile *mf;
  pointer pcVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  size_t sVar7;
  ostream *poVar8;
  pointer pbVar9;
  int iVar10;
  size_type sVar11;
  pointer ppVar12;
  WrapQuotes in_R8D;
  pointer pbVar13;
  string_view str;
  string sStack_c0;
  cmTestGenerator *pcStack_a0;
  int iStack_94;
  string sStack_90;
  string sStack_70;
  pointer pbStack_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vStack_48;
  
  if ((this->super_cmScriptGenerator).ActionsPerConfig == true) {
    cmScriptGenerator::GenerateScriptActions(&this->super_cmScriptGenerator,os,indent);
    return;
  }
  this->TestGenerated = true;
  pcVar2 = this->Test;
  mf = pcVar2->Makefile;
  pcVar3 = (pcVar2->Name)._M_dataplus._M_p;
  pcStack_a0 = this;
  iStack_94 = indent.Level;
  sStack_90._M_dataplus._M_p = (pointer)&sStack_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_90,pcVar3,pcVar3 + (pcVar2->Name)._M_string_length);
  bVar6 = anon_unknown.dwarf_485809::needToQuoteTestName(mf,&sStack_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_90._M_dataplus._M_p != &sStack_90.field_2) {
    operator_delete(sStack_90._M_dataplus._M_p,sStack_90.field_2._M_allocated_capacity + 1);
  }
  sStack_70._M_dataplus._M_p = (pointer)&sStack_70.field_2;
  pcVar3 = (pcStack_a0->Test->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_70,pcVar3,pcVar3 + (pcStack_a0->Test->Name)._M_string_length);
  sVar7 = anon_unknown.dwarf_485809::countMaxConsecutiveEqualSigns(&sStack_70);
  iVar10 = iStack_94;
  sStack_90._M_dataplus._M_p = (pointer)&sStack_90.field_2;
  std::__cxx11::string::_M_construct((ulong)&sStack_90,(char)sVar7 + '\x01');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_70._M_dataplus._M_p != &sStack_70.field_2) {
    operator_delete(sStack_70._M_dataplus._M_p,sStack_70.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = pcStack_a0->Test;
  pbVar4 = (pcVar2->Command).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sStack_70._M_dataplus._M_p = (pointer)&sStack_70.field_2;
  pcVar3 = (pbVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&sStack_70,pcVar3,pcVar3 + pbVar4->_M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&sStack_70);
  if (bVar6) {
    if (0 < iVar10) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test([",10);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,sStack_90._M_dataplus._M_p,sStack_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    pcVar3 = (pcStack_a0->Test->Name)._M_dataplus._M_p;
    sStack_c0._M_dataplus._M_p = (pointer)&sStack_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_c0,pcVar3,pcVar3 + (pcStack_a0->Test->Name)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,sStack_c0._M_dataplus._M_p,sStack_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,sStack_90._M_dataplus._M_p,sStack_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] \"",3);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,sStack_70._M_dataplus._M_p,sStack_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_c0._M_dataplus._M_p == &sStack_c0.field_2) goto LAB_001fdc53;
  }
  else {
    if (0 < iVar10) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
    pcVar3 = (pcStack_a0->Test->Name)._M_dataplus._M_p;
    sStack_c0._M_dataplus._M_p = (pointer)&sStack_c0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_c0,pcVar3,pcVar3 + (pcStack_a0->Test->Name)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,sStack_c0._M_dataplus._M_p,sStack_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," \"",2);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,sStack_70._M_dataplus._M_p,sStack_70._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_c0._M_dataplus._M_p == &sStack_c0.field_2) goto LAB_001fdc53;
  }
  operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
LAB_001fdc53:
  pbVar13 = (pcVar2->Command).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbStack_50 = (pcVar2->Command).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = pbVar13 + 1;
  if (pbVar4 != pbStack_50) {
    do {
      pbVar9 = pbVar4;
      std::__ostream_insert<char,std::char_traits<char>>(os," \"",2);
      sVar5 = pbVar13[1]._M_string_length;
      if (sVar5 != 0) {
        pcVar3 = (pbVar9->_M_dataplus)._M_p;
        sVar11 = 0;
        do {
          cVar1 = pcVar3[sVar11];
          if (cVar1 == '\"') {
            sStack_c0._M_dataplus._M_p._0_1_ = 0x5c;
            std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_c0,1);
          }
          sStack_c0._M_dataplus._M_p._0_1_ = cVar1;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_c0,1);
          sVar11 = sVar11 + 1;
        } while (sVar5 != sVar11);
      }
      sStack_c0._M_dataplus._M_p._0_1_ = 0x22;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&sStack_c0,1);
      pbVar4 = pbVar9 + 1;
      pbVar13 = pbVar9;
    } while (pbVar9 + 1 != pbStack_50);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if (bVar6) {
    iVar10 = iStack_94;
    if (0 < iStack_94) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties([",0x16);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,sStack_90._M_dataplus._M_p,sStack_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[",1);
    sStack_c0._M_dataplus._M_p = (pointer)&sStack_c0.field_2;
    pcVar3 = (pcStack_a0->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_c0,pcVar3,pcVar3 + (pcStack_a0->Test->Name)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,sStack_c0._M_dataplus._M_p,sStack_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,sStack_90._M_dataplus._M_p,sStack_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] PROPERTIES ",0xd);
  }
  else {
    iVar10 = iStack_94;
    if (0 < iStack_94) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
    sStack_c0._M_dataplus._M_p = (pointer)&sStack_c0.field_2;
    pcVar3 = (pcStack_a0->Test->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_c0,pcVar3,pcVar3 + (pcStack_a0->Test->Name)._M_string_length);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,sStack_c0._M_dataplus._M_p,sStack_c0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," PROPERTIES ",0xc);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
    operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
  }
  cmPropertyMap::GetList_abi_cxx11_(&vStack_48,&pcStack_a0->Test->Properties);
  if (vStack_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      vStack_48.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar12 = vStack_48.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(ppVar12->first)._M_dataplus._M_p,(ppVar12->first)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      str._M_str = (char *)0x0;
      str._M_len = (size_t)(ppVar12->second)._M_dataplus._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                (&sStack_c0,(cmOutputConverter *)(ppVar12->second)._M_string_length,str,in_R8D);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,sStack_c0._M_dataplus._M_p,sStack_c0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_c0._M_dataplus._M_p != &sStack_c0.field_2) {
        operator_delete(sStack_c0._M_dataplus._M_p,sStack_c0.field_2._M_allocated_capacity + 1);
      }
      ppVar12 = ppVar12 + 1;
    } while (ppVar12 !=
             vStack_48.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&vStack_48);
  GenerateInternalProperties(pcStack_a0,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_70._M_dataplus._M_p != &sStack_70.field_2) {
    operator_delete(sStack_70._M_dataplus._M_p,sStack_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_90._M_dataplus._M_p != &sStack_90.field_2) {
    operator_delete(sStack_90._M_dataplus._M_p,sStack_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptActions(std::ostream& os, Indent indent)
{
  if (this->ActionsPerConfig) {
    // This is the per-config generation in a single-configuration
    // build generator case.  The superclass will call our per-config
    // method.
    this->cmScriptGenerator::GenerateScriptActions(os, indent);
  } else {
    // This is an old-style test, so there is only one config.
    // assert(this->Test->GetOldStyle());
    this->GenerateOldStyle(os, indent);
  }
}